

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::AllocateBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                 *this,size_t bytes,BYTE **ppBuffer,ushort pdataCount,ushort xdataSize,
                bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  code *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  TEmitBufferAllocation *allocation;
  SIZE_T SVar5;
  undefined7 in_register_00000089;
  undefined1 local_80 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  AutoRealOrFakeCriticalSection<CriticalSection> local_40;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  
  autoCs.cs._4_4_ = (undefined4)CONCAT71(in_register_00000089,canAllocInPreReservedHeapPageSegment);
  local_40.cs = &this->criticalSection;
  CCLock::Enter(&(local_40.cs)->super_CCLock);
  uVar2 = autoCs.cs._4_4_;
  memBasicInfo._40_8_ = ppBuffer;
  if (ppBuffer == (BYTE **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x161,"(ppBuffer != nullptr)","ppBuffer != nullptr");
    if (!bVar3) goto LAB_003ed71b;
    *puVar4 = 0;
  }
  allocation = NewAllocation(this,bytes,pdataCount,xdataSize,SUB41(uVar2,0),isAnyJittedCode);
  GetBuffer(this,allocation,bytes,(BYTE **)memBasicInfo._40_8_);
  SVar5 = VirtualQueryEx(this->processHandle,allocation->allocation->address,
                         (PMEMORY_BASIC_INFORMATION)local_80,0x30);
  if ((SVar5 != 0) && (memBasicInfo.RegionSize._4_4_ != 0x20)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x16a,"(resultBytes == 0 || memBasicInfo.Protect == 0x20)",
                       "resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ");
    if (!bVar3) {
LAB_003ed71b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_40);
  return allocation;
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc>*
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::AllocateBuffer(__in size_t bytes, __deref_bcount(bytes) BYTE** ppBuffer, ushort pdataCount /*=0*/, ushort xdataSize  /*=0*/, bool canAllocInPreReservedHeapPageSegment /*=false*/,
    bool isAnyJittedCode /* = false*/)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(ppBuffer != nullptr);

    TEmitBufferAllocation * allocation = this->NewAllocation(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode);

    GetBuffer(allocation, bytes, ppBuffer);

#if DBG
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQueryEx(this->processHandle, allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    Assert(resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ);
#endif

    return allocation;
}